

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

int Abc_NodeGetLeafCostOne(Abc_Obj_t *pNode,int nFaninLimit)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int Cost;
  int nFaninLimit_local;
  Abc_Obj_t *pNode_local;
  
  if ((*(uint *)&pNode->field_0x14 >> 5 & 1) != 1) {
    __assert_fail("pNode->fMarkB == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x82,"int Abc_NodeGetLeafCostOne(Abc_Obj_t *, int)");
  }
  iVar2 = Abc_ObjIsCi(pNode);
  if (iVar2 == 0) {
    pAVar3 = Abc_ObjFanin0(pNode);
    uVar1 = *(uint *)&pAVar3->field_0x14;
    pAVar3 = Abc_ObjFanin1(pNode);
    pNode_local._4_4_ =
         (uint)(((uVar1 >> 5 & 1) != 0 ^ 0xffU) & 1) +
         (uint)(((*(uint *)&pAVar3->field_0x14 >> 5 & 1) != 0 ^ 0xffU) & 1);
    if ((1 < pNode_local._4_4_) && (iVar2 = Abc_ObjFanoutNum(pNode), nFaninLimit < iVar2)) {
      pNode_local._4_4_ = 999;
    }
  }
  else {
    pNode_local._4_4_ = 999;
  }
  return pNode_local._4_4_;
}

Assistant:

static inline int Abc_NodeGetLeafCostOne( Abc_Obj_t * pNode, int nFaninLimit )
{
    int Cost;
    // make sure the node is in the construction zone
    assert( pNode->fMarkB == 1 );  
    // cannot expand over the PI node
    if ( Abc_ObjIsCi(pNode) )
        return 999;
    // get the cost of the cone
    Cost = (!Abc_ObjFanin0(pNode)->fMarkB) + (!Abc_ObjFanin1(pNode)->fMarkB);
    // always accept if the number of leaves does not increase
    if ( Cost < 2 )
        return Cost;
    // skip nodes with many fanouts
    if ( Abc_ObjFanoutNum(pNode) > nFaninLimit )
        return 999;
    // return the number of nodes that will be on the leaves if this node is removed
    return Cost;
}